

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryInvocationCase::genVertexAttribData
          (GeometryInvocationCase *this)

{
  reference pvVar1;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  Vector<float,_4> local_20;
  GeometryInvocationCase *local_10;
  GeometryInvocationCase *this_local;
  
  local_10 = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexPosData,2);
  tcu::Vector<float,_4>::Vector(&local_20,0.0,-0.3,0.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexPosData,0);
  *(undefined8 *)pvVar1->m_data = local_20.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_20.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_30,0.2,0.3,0.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexPosData,1);
  *(undefined8 *)pvVar1->m_data = local_30.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_30.m_data._8_8_;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,2);
  tcu::Vector<float,_4>::Vector(&local_40,1.0,1.0,1.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,0);
  *(undefined8 *)pvVar1->m_data = local_40.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_40.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_50,0.8,0.8,0.8,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,1);
  *(undefined8 *)pvVar1->m_data = local_50.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_50.m_data._8_8_;
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = 2;
  return;
}

Assistant:

void GeometryInvocationCase::genVertexAttribData (void)
{
	m_vertexPosData.resize(2);
	m_vertexPosData[0] = tcu::Vec4(0.0f,-0.3f, 0.0f, 1.0f);
	m_vertexPosData[1] = tcu::Vec4(0.2f, 0.3f, 0.0f, 1.0f);

	m_vertexAttrData.resize(2);
	m_vertexAttrData[0] = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
	m_vertexAttrData[1] = tcu::Vec4(0.8f, 0.8f, 0.8f, 1.0f);
	m_numDrawVertices = 2;
}